

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplaceRealloc<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
           *this,pointer pos,
          unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *args)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  ulong *puVar4;
  pointer puVar5;
  undefined8 *puVar6;
  long lVar7;
  Lexer *pLVar8;
  Lexer *ctx;
  long lVar9;
  
  if (*(long *)(this + 8) == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pLVar8 = (Lexer *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (Lexer *)(uVar1 * 2);
  if (pLVar8 < ctx) {
    pLVar8 = ctx;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    pLVar8 = (Lexer *)0xfffffffffffffff;
  }
  lVar9 = (long)pos - *(long *)this;
  puVar4 = (ulong *)operator_new((long)pLVar8 * 8);
  *(Lexer **)((long)puVar4 + lVar9) =
       (args->_M_t).
       super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
       _M_t.
       super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
       super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
  puVar5 = *(pointer *)this;
  lVar2 = *(long *)(this + 8);
  puVar3 = puVar4;
  if (puVar5 + lVar2 == pos) {
    if (lVar2 != 0) {
      lVar7 = 0;
      do {
        ctx = *(Lexer **)
               ((long)&(puVar5->_M_t).
                       super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                       .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl + lVar7);
        *(Lexer **)((long)puVar4 + lVar7) = ctx;
        *(undefined8 *)
         ((long)&(puVar5->_M_t).
                 super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                 .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl + lVar7) = 0;
        lVar7 = lVar7 + 8;
      } while (lVar2 << 3 != lVar7);
    }
  }
  else {
    for (; puVar5 != pos; puVar5 = puVar5 + 1) {
      ctx = (puVar5->_M_t).
            super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
            .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
      *puVar3 = (ulong)ctx;
      (puVar5->_M_t).
      super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t
      .super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
      super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
      puVar3 = puVar3 + 1;
    }
    puVar5 = (pointer)(lVar2 * 8 + *(long *)this);
    if (puVar5 != pos) {
      puVar6 = (undefined8 *)(lVar9 + (long)puVar4);
      do {
        puVar6 = puVar6 + 1;
        *puVar6 = (pos->_M_t).
                  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                  .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
        (pos->_M_t).
        super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
        _M_t.
        super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
        .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
        pos = pos + 1;
      } while (pos != puVar5);
    }
  }
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::cleanup((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
             *)this,(EVP_PKEY_CTX *)ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(Lexer **)(this + 0x10) = pLVar8;
  *(ulong **)this = puVar4;
  return (pointer)((long)puVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}